

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O0

int get_rate_guided_quantizer(AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int in_ECX;
  int in_EDX;
  BLOCK_SIZE in_SIL;
  AV1_COMP *in_RDI;
  double dVar4;
  double dVar5;
  int qindex;
  int max_offset;
  DeltaQInfo *delta_q_info;
  int offset;
  int base_qindex;
  AV1_COMMON *cm;
  double min_max_scale;
  double scale;
  double rate_diff;
  double weight;
  int this_col;
  int this_row;
  int c;
  int r;
  int col;
  int row;
  double sb_rate_uniform;
  double sb_rate_hific;
  int block_step;
  int mb_step;
  int local_bc;
  int local_b8;
  int local_b4;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  double dVar6;
  int local_88;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  double local_30;
  double local_28;
  
  uVar3 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [in_RDI->weber_bsize];
  local_28 = 0.0;
  local_30 = 0.0;
  for (local_34 = in_EDX; local_38 = in_ECX,
      local_34 <
      (int)(in_EDX + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [in_SIL]); local_34 = local_34 + 4) {
    for (; local_38 <
           (int)(in_ECX + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                [in_SIL]); local_38 = local_38 + 4) {
      local_28 = in_RDI->ext_rate_distribution
                 [(local_34 / (int)uVar3) * (in_RDI->frame_info).mi_cols + local_38 / (int)uVar3] +
                 local_28;
      for (local_3c = 0; local_3c < 4; local_3c = uVar3 + local_3c) {
        for (local_40 = 0; local_40 < 4; local_40 = uVar3 + local_40) {
          local_30 = (double)in_RDI->prep_rate_estimates
                             [((local_34 + local_3c) / (int)uVar3) * (in_RDI->frame_info).mi_cols +
                              (local_38 + local_40) / (int)uVar3] + local_30;
        }
      }
    }
  }
  dVar4 = pow(2.0,((in_RDI->ext_rate_scale * local_28 - local_30) * 1.0) / local_30);
  dVar5 = get_max_scale(in_RDI,in_SIL,in_EDX,in_ECX);
  if (1.0 <= dVar5) {
    dVar5 = get_max_scale(in_RDI,in_SIL,in_EDX,in_ECX);
  }
  else {
    dVar5 = 1.0;
  }
  dVar6 = dVar5;
  if (1.0 / (dVar4 * dVar4) < dVar5) {
    dVar6 = 1.0 / (dVar4 * dVar4);
  }
  iVar1 = (in_RDI->common).quant_params.base_qindex;
  local_b4 = av1_get_deltaq_offset
                       (SUB84(dVar5,0),(int)((ulong)dVar6 >> 0x20),
                        (double)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  iVar2 = (in_RDI->common).delta_q_info.delta_q_res;
  if (iVar2 * 10 + -1 <= local_b4) {
    local_b4 = iVar2 * 10 + -1;
  }
  if (local_b4 <= iVar2 * -10 + 1) {
    local_b4 = iVar2 * -10 + 1;
  }
  local_b4 = (in_RDI->common).quant_params.base_qindex + local_b4;
  if (0xfe < local_b4) {
    local_b4 = 0xff;
  }
  if (local_b4 < 1) {
    local_b8 = 0;
  }
  else {
    local_b8 = local_b4;
  }
  local_88 = local_b8;
  if (0 < iVar1) {
    if (local_b8 < 2) {
      local_bc = 1;
    }
    else {
      local_bc = local_b8;
    }
    local_88 = local_bc;
  }
  return local_88;
}

Assistant:

static int get_rate_guided_quantizer(const AV1_COMP *const cpi,
                                     BLOCK_SIZE bsize, int mi_row, int mi_col) {
  // Calculation uses 8x8.
  const int mb_step = mi_size_wide[cpi->weber_bsize];
  // Accumulate to 16x16
  const int block_step = mi_size_wide[BLOCK_16X16];
  double sb_rate_hific = 0.0;
  double sb_rate_uniform = 0.0;
  for (int row = mi_row; row < mi_row + mi_size_wide[bsize];
       row += block_step) {
    for (int col = mi_col; col < mi_col + mi_size_high[bsize];
         col += block_step) {
      sb_rate_hific +=
          cpi->ext_rate_distribution[(row / mb_step) * cpi->frame_info.mi_cols +
                                     (col / mb_step)];

      for (int r = 0; r < block_step; r += mb_step) {
        for (int c = 0; c < block_step; c += mb_step) {
          const int this_row = row + r;
          const int this_col = col + c;
          sb_rate_uniform +=
              cpi->prep_rate_estimates[(this_row / mb_step) *
                                           cpi->frame_info.mi_cols +
                                       (this_col / mb_step)];
        }
      }
    }
  }
  sb_rate_hific *= cpi->ext_rate_scale;

  const double weight = 1.0;
  const double rate_diff =
      weight * (sb_rate_hific - sb_rate_uniform) / sb_rate_uniform;
  double scale = pow(2, rate_diff);

  scale = scale * scale;
  double min_max_scale = AOMMAX(1.0, get_max_scale(cpi, bsize, mi_row, mi_col));
  scale = 1.0 / AOMMIN(1.0 / scale, min_max_scale);

  const AV1_COMMON *const cm = &cpi->common;
  const int base_qindex = cm->quant_params.base_qindex;
  int offset =
      av1_get_deltaq_offset(cm->seq_params->bit_depth, base_qindex, scale);
  const DeltaQInfo *const delta_q_info = &cm->delta_q_info;
  const int max_offset = delta_q_info->delta_q_res * 10;
  offset = AOMMIN(offset, max_offset - 1);
  offset = AOMMAX(offset, -max_offset + 1);
  int qindex = cm->quant_params.base_qindex + offset;
  qindex = AOMMIN(qindex, MAXQ);
  qindex = AOMMAX(qindex, MINQ);
  if (base_qindex > MINQ) qindex = AOMMAX(qindex, MINQ + 1);

  return qindex;
}